

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ircode.c
# Opt level: O2

uint32_t ircode_register_pop_context_protect(ircode_t *code,_Bool protect)

{
  uint uVar1;
  size_t sVar2;
  
  sVar2 = (code->registers).n;
  if (sVar2 == 0) {
    return 0xffffffff;
  }
  (code->registers).n = sVar2 - 1;
  uVar1 = (code->registers).p[sVar2 - 1];
  if (protect) {
    code->state[uVar1] = true;
    if (code->nlocals <= uVar1) {
      (code->context).p[(code->context).n - 1][uVar1] = true;
    }
  }
  else if (code->nlocals <= uVar1) {
    code->state[uVar1] = false;
    return uVar1;
  }
  return uVar1;
}

Assistant:

uint32_t ircode_register_pop_context_protect (ircode_t *code, bool protect) {
    if (marray_size(code->registers) == 0) return REGISTER_ERROR;
    uint32_t value = (uint32_t)marray_pop(code->registers);

    if (protect) code->state[value] = true;
    else if (value >= code->nlocals) code->state[value] = false;

    if (protect && value >= code->nlocals) {
        bool *context = marray_last(code->context);
        context[value] = true;
    }

    DEBUG_REGISTER("POP REGISTER %d", value);
    return value;
}